

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneST.cpp
# Opt level: O0

void __thiscall
PermutazioneST::randomBS
          (PermutazioneST *this,PermutazioneST *p,uint limiteTrasposizioni,unsigned_short *risultato
          )

{
  ushort uVar1;
  undefined2 uVar2;
  int iVar3;
  void *pvVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort local_62;
  unsigned_short temp;
  unsigned_short randomZeta;
  unsigned_short random;
  unsigned_short i;
  uint contatoreTrasposizioni;
  uint cursoreTrasposizioni;
  unsigned_short cursoreZeta;
  unsigned_short *zeta;
  PermutazioneST pCopia;
  unsigned_short *risultato_local;
  uint limiteTrasposizioni_local;
  PermutazioneST *p_local;
  PermutazioneST *this_local;
  
  pCopia.super_Permutazione._16_8_ = risultato;
  PermutazioneST((PermutazioneST *)&zeta,(p->super_Permutazione).individuo,
                 (p->super_Permutazione).dimensione);
  uVar7 = (ulong)(p->super_Permutazione).dimensione - 1;
  uVar8 = uVar7 * 2;
  if (CARRY8(uVar7,uVar7)) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar8);
  contatoreTrasposizioni._2_2_ = 0;
  _temp = 0;
  for (local_62 = 0; (int)(uint)local_62 < (int)((p->super_Permutazione).dimensione - 1);
      local_62 = local_62 + 1) {
    if ((p->super_Permutazione).individuo[(int)(local_62 + 1)] <
        (p->super_Permutazione).individuo[local_62]) {
      *(ushort *)((long)pvVar4 + (ulong)contatoreTrasposizioni._2_2_ * 2) = local_62;
      contatoreTrasposizioni._2_2_ = contatoreTrasposizioni._2_2_ + 1;
    }
  }
  while (contatoreTrasposizioni._2_2_ != 0 && _temp < limiteTrasposizioni) {
    iVar3 = Random::randIntU(&genRand,0,contatoreTrasposizioni._2_2_ - 1);
    uVar1 = *(ushort *)((long)pvVar4 + (ulong)(ushort)iVar3 * 2);
    uVar6 = _temp + 1;
    *(ushort *)(pCopia.super_Permutazione._16_8_ + (ulong)_temp * 2) = uVar1;
    uVar2 = *(undefined2 *)((long)pCopia.super_Permutazione._vptr_Permutazione + (ulong)uVar1 * 2);
    *(undefined2 *)((long)pCopia.super_Permutazione._vptr_Permutazione + (ulong)uVar1 * 2) =
         *(undefined2 *)
          ((long)pCopia.super_Permutazione._vptr_Permutazione + (long)(int)(uVar1 + 1) * 2);
    *(undefined2 *)((long)pCopia.super_Permutazione._vptr_Permutazione + (long)(int)(uVar1 + 1) * 2)
         = uVar2;
    uVar5 = contatoreTrasposizioni._2_2_ - 1;
    *(undefined2 *)((long)pvVar4 + (ulong)(ushort)iVar3 * 2) =
         *(undefined2 *)((long)pvVar4 + (ulong)uVar5 * 2);
    if (((uVar1 != 0) &&
        (*(ushort *)((long)pCopia.super_Permutazione._vptr_Permutazione + (ulong)uVar1 * 2) <
         *(ushort *)
          ((long)pCopia.super_Permutazione._vptr_Permutazione + (long)(int)(uVar1 - 1) * 2))) &&
       (*(ushort *)((long)pCopia.super_Permutazione._vptr_Permutazione + (long)(int)(uVar1 - 1) * 2)
        < *(ushort *)
           ((long)pCopia.super_Permutazione._vptr_Permutazione + (long)(int)(uVar1 + 1) * 2))) {
      *(ushort *)((long)pvVar4 + (ulong)uVar5 * 2) = uVar1 - 1;
      uVar5 = contatoreTrasposizioni._2_2_;
    }
    contatoreTrasposizioni._2_2_ = uVar5;
    _temp = uVar6;
    if (((uVar1 + 2 < (uint)(p->super_Permutazione).dimensione) &&
        (*(ushort *)
          ((long)pCopia.super_Permutazione._vptr_Permutazione + (long)(int)(uVar1 + 2) * 2) <
         *(ushort *)
          ((long)pCopia.super_Permutazione._vptr_Permutazione + (long)(int)(uVar1 + 1) * 2))) &&
       (*(ushort *)((long)pCopia.super_Permutazione._vptr_Permutazione + (ulong)uVar1 * 2) <
        *(ushort *)((long)pCopia.super_Permutazione._vptr_Permutazione + (long)(int)(uVar1 + 2) * 2)
       )) {
      *(ushort *)((long)pvVar4 + (ulong)contatoreTrasposizioni._2_2_ * 2) = uVar1 + 1;
      contatoreTrasposizioni._2_2_ = contatoreTrasposizioni._2_2_ + 1;
    }
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  ~PermutazioneST((PermutazioneST *)&zeta);
  return;
}

Assistant:

void PermutazioneST::randomBS(PermutazioneST& p, unsigned int limiteTrasposizioni, unsigned short* risultato) {

	PermutazioneST pCopia(p.individuo, p.dimensione);

	unsigned short* zeta = new unsigned short[p.dimensione - 1];
	unsigned short cursoreZeta = 0;

	unsigned int cursoreTrasposizioni = 0;
	unsigned int contatoreTrasposizioni = 0;

	for (unsigned short i = 0; i < p.dimensione - 1; i++) {
		if (p.individuo[i] > p.individuo[i + 1])
			zeta[cursoreZeta++] = i;
	}

	unsigned short random, randomZeta, temp;

	while (cursoreZeta > 0 && contatoreTrasposizioni < limiteTrasposizioni) {

		random = genRand.randIntU(0, cursoreZeta - 1);
		randomZeta = zeta[random];

		risultato[contatoreTrasposizioni++] = randomZeta;


		temp = pCopia.individuo[randomZeta];
		pCopia.individuo[randomZeta] = pCopia.individuo[randomZeta + 1];
		pCopia.individuo[randomZeta + 1] = temp;

		zeta[random] = zeta[--cursoreZeta];

		if (randomZeta > 0 && pCopia.individuo[randomZeta - 1] > pCopia.individuo[randomZeta] &&
			pCopia.individuo[randomZeta - 1] < pCopia.individuo[randomZeta + 1])
			zeta[cursoreZeta++] = randomZeta - 1;

		if (randomZeta + 2 < p.dimensione && pCopia.individuo[randomZeta + 1] > pCopia.individuo[randomZeta + 2] &&
			pCopia.individuo[randomZeta] < pCopia.individuo[randomZeta + 2])
			zeta[cursoreZeta++] = randomZeta + 1;

	}

	delete[] zeta;
}